

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsTTDCreateContext(JsRuntimeHandle runtimeHandle,bool useRuntimeTTDMode,JsContextRef *newContext)

{
  anon_class_24_3_0072d35a fn;
  JsErrorCode JVar1;
  bool *in_stack_ffffffffffffffc0;
  JsContextRef *newContext_local;
  JsRuntimeHandle pvStack_10;
  bool useRuntimeTTDMode_local;
  JsRuntimeHandle runtimeHandle_local;
  
  fn.runtimeHandle = (JsRuntimeHandle *)((long)&newContext_local + 7);
  fn.newContext = (JsContextRef **)&stack0xfffffffffffffff0;
  fn.useRuntimeTTDMode = in_stack_ffffffffffffffc0;
  newContext_local._7_1_ = useRuntimeTTDMode;
  pvStack_10 = runtimeHandle;
  JVar1 = GlobalAPIWrapper_NoRecord<JsTTDCreateContext::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsTTDCreateContext(_In_ JsRuntimeHandle runtimeHandle, _In_ bool useRuntimeTTDMode, _Out_ JsContextRef *newContext)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        PARAM_NOT_NULL(newContext);
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();
        TTDAssert(threadContext->IsRuntimeInTTDMode(), "Need to create in TTD Mode.");

        bool inRecord = false;
        bool activelyRecording = false;
        bool inReplay = false;
        TTDRecorder dummyActionEntryPopper;
        if(useRuntimeTTDMode)
        {
            threadContext->TTDLog->GetModesForExplicitContextCreate(inRecord, activelyRecording, inReplay);
        }

        return CreateContextCore(runtimeHandle, dummyActionEntryPopper, inRecord, activelyRecording, inReplay, newContext);
    });
#endif
}